

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS
ref_interp_convergence_rate
          (REF_DBL f3,REF_DBL h3,REF_DBL f2,REF_DBL h2,REF_DBL f1,REF_DBL h1,REF_DBL *rate)

{
  double __x;
  double dVar1;
  double dVar2;
  double local_100;
  double local_d8;
  double local_c8;
  double local_b8;
  double local_a8;
  double local_a0;
  double local_98;
  int local_8c;
  REF_INT i;
  REF_DBL last_p;
  REF_DBL p;
  REF_DBL omega;
  REF_DBL beta;
  REF_DBL r23;
  REF_DBL r12;
  REF_DBL e23;
  REF_DBL e12;
  REF_DBL *rate_local;
  REF_DBL h1_local;
  REF_DBL f1_local;
  REF_DBL h2_local;
  REF_DBL f2_local;
  REF_DBL h3_local;
  REF_DBL f3_local;
  
  *rate = -1.0;
  if (f1 - f2 <= 0.0) {
    local_98 = -(f1 - f2);
  }
  else {
    local_98 = f1 - f2;
  }
  if (f2 - f3 <= 0.0) {
    local_a0 = -(f2 - f3);
  }
  else {
    local_a0 = f2 - f3;
  }
  __x = h2 / h1;
  last_p = log(local_a0 / local_98);
  for (local_8c = 0; local_8c < 0x14; local_8c = local_8c + 1) {
    if (local_98 * 1e+20 <= 0.0) {
      local_a8 = -(local_98 * 1e+20);
    }
    else {
      local_a8 = local_98 * 1e+20;
    }
    if (local_a0 <= 0.0) {
      local_b8 = -local_a0;
    }
    else {
      local_b8 = local_a0;
    }
    if (local_a8 <= local_b8) {
      return 0;
    }
    dVar1 = pow(__x,last_p);
    dVar2 = pow(h3 / h2,last_p);
    dVar1 = ((dVar1 - 1.0) / (dVar2 - 1.0)) * (local_a0 / local_98);
    dVar2 = log(__x);
    if (dVar2 * 1e+20 <= 0.0) {
      dVar2 = log(__x);
      local_c8 = -(dVar2 * 1e+20);
    }
    else {
      local_c8 = log(__x);
      local_c8 = local_c8 * 1e+20;
    }
    dVar2 = log(dVar1);
    if (dVar2 <= 0.0) {
      local_d8 = log(dVar1);
      local_d8 = -local_d8;
    }
    else {
      local_d8 = log(dVar1);
    }
    if (local_c8 <= local_d8) {
      return 0;
    }
    dVar1 = log(dVar1);
    dVar2 = log(__x);
    dVar1 = last_p * 0.5 + (dVar1 * 0.5) / dVar2;
    if (dVar1 - last_p <= 0.0) {
      local_100 = -(dVar1 - last_p);
    }
    else {
      local_100 = dVar1 - last_p;
    }
    last_p = dVar1;
    if (local_100 < 0.0001) break;
  }
  *rate = last_p;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_interp_convergence_rate(REF_DBL f3, REF_DBL h3,
                                               REF_DBL f2, REF_DBL h2,
                                               REF_DBL f1, REF_DBL h1,
                                               REF_DBL *rate) {
  REF_DBL e12, e23, r12, r23;
  REF_DBL beta, omega = 0.5;
  REF_DBL p, last_p;
  REF_INT i;
  /*   AIAA JOURNAL Vol. 36, No. 5, May 1998
       Verification of Codes and Calculations
       Patrick J. Roache */
  /*
  f3 = a coarse grid numerical solution obtained with grid spacing h3
  f2 = a medium grid numerical solution obtained with grid spacing h2
  f1 = a fine grid numerical solution obtained with grid spacing h1
  */
  *rate = -1.0;
  e12 = ABS(f1 - f2);
  e23 = ABS(f2 - f3);
  r12 = h2 / h1;
  r23 = h3 / h2;
  p = log(e23 / e12);
  for (i = 0; i < 20; i++) {
    last_p = p;
    if (!ref_math_divisible(e23, e12)) return REF_SUCCESS;
    beta = ((pow(r12, p) - 1.0) / (pow(r23, p) - 1.0)) * (e23 / e12);
    if (!ref_math_divisible(log(beta), log(r12))) return REF_SUCCESS;
    p = omega * p + (1.0 - omega) * log(beta) / log(r12);
    if (ABS(p - last_p) < 0.0001) break;
  }
  *rate = p;
  return REF_SUCCESS;
}